

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

ON_Line * __thiscall
ON_MeshTopology::TopEdgeLine(ON_Line *__return_storage_ptr__,ON_MeshTopology *this,int tope_index)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int point_index;
  ON_Mesh *mesh;
  ON_MeshTopologyEdge *pOVar5;
  ON_MeshTopologyVertex *pOVar6;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  long lVar7;
  ON_3dPointListRef vertex_list;
  ON_3dPoint local_58;
  ON_3dPointListRef local_40;
  
  from_pt.y = ON_3dPoint::UnsetPoint.y;
  from_pt.x = ON_3dPoint::UnsetPoint.x;
  from_pt.z = ON_3dPoint::UnsetPoint.z;
  to_pt.y = ON_3dPoint::UnsetPoint.y;
  to_pt.x = ON_3dPoint::UnsetPoint.x;
  to_pt.z = ON_3dPoint::UnsetPoint.z;
  ON_Line::ON_Line(__return_storage_ptr__,from_pt,to_pt);
  if (((-1 < tope_index) && (mesh = this->m_mesh, mesh != (ON_Mesh *)0x0)) &&
     (tope_index < (this->m_tope).m_count)) {
    pOVar5 = (this->m_tope).m_a;
    iVar1 = pOVar5[(uint)tope_index].m_topvi[0];
    lVar7 = (long)iVar1;
    if ((-1 < lVar7) && (uVar2 = (this->m_topv).m_count, iVar1 < (int)uVar2)) {
      uVar3 = pOVar5[(uint)tope_index].m_topvi[1];
      if (uVar3 < uVar2 && -1 < (int)uVar3) {
        pOVar6 = (this->m_topv).m_a;
        if (((0 < pOVar6[lVar7].m_v_count) && (pOVar6[lVar7].m_vi != (int *)0x0)) &&
           ((0 < pOVar6[uVar3].m_v_count &&
            ((((pOVar6[uVar3].m_vi != (int *)0x0 && (iVar1 = *pOVar6[lVar7].m_vi, -1 < iVar1)) &&
              (iVar4 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count, iVar1 < iVar4)) &&
             ((point_index = *pOVar6[uVar3].m_vi, -1 < point_index && (point_index < iVar4)))))))) {
          ON_3dPointListRef::ON_3dPointListRef(&local_40,mesh);
          ON_3dPointListRef::operator[](&local_58,&local_40,iVar1);
          (__return_storage_ptr__->from).z = local_58.z;
          (__return_storage_ptr__->from).x = local_58.x;
          (__return_storage_ptr__->from).y = local_58.y;
          ON_3dPointListRef::operator[](&local_58,&local_40,point_index);
          (__return_storage_ptr__->to).z = local_58.z;
          (__return_storage_ptr__->to).x = local_58.x;
          (__return_storage_ptr__->to).y = local_58.y;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ON_Line ON_MeshTopology::TopEdgeLine( int tope_index ) const
{
  ON_Line L(ON_3dPoint::UnsetPoint,ON_3dPoint::UnsetPoint);
  if ( m_mesh && tope_index >= 0 && tope_index < m_tope.Count() )
  {
    const int* topvi = m_tope[tope_index].m_topvi;
    if (   topvi[0] >= 0 && topvi[0] < m_topv.Count() 
        && topvi[1] >= 0 && topvi[1] < m_topv.Count() )
    {
      const ON_MeshTopologyVertex& v0 = m_topv[topvi[0]];
      const ON_MeshTopologyVertex& v1 = m_topv[topvi[1]];
      if ( v0.m_v_count > 0 && v0.m_vi && v1.m_v_count > 0 && v1.m_vi )
      {
        int vi0 = v0.m_vi[0];
        int vi1 = v1.m_vi[0];
        int vcount = m_mesh->m_V.Count();
        if ( vi0 >= 0 && vi0 < vcount && vi1 >= 0 && vi1 < vcount )
        {
          const ON_3dPointListRef vertex_list(m_mesh);
          L.from = vertex_list[vi0];
          L.to   = vertex_list[vi1];
        }
      }
    }
  }
  return L;
}